

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_writer.h
# Opt level: O2

ssize_t __thiscall
cppwinrt::writer_base<cppwinrt::writer>::write
          (writer_base<cppwinrt::writer> *this,int __fd,void *__buf,size_t __n)

{
  ssize_t sVar1;
  undefined4 in_register_00000034;
  string local_40;
  string_view local_20;
  
  std::__cxx11::to_string(&local_40,CONCAT44(in_register_00000034,__fd));
  local_20._M_len = local_40._M_string_length;
  local_20._M_str = local_40._M_dataplus._M_p;
  write_impl(this,&local_20);
  sVar1 = std::__cxx11::string::~string((string *)&local_40);
  return sVar1;
}

Assistant:

void write(unsigned long const value)
        {
            write(std::to_string(value));
        }